

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::cleanup_member_name_mapping(t_netstd_generator *this,void *scope)

{
  bool bVar1;
  reference pvVar2;
  undefined8 *puVar3;
  member_mapping_scope *active;
  void *scope_local;
  t_netstd_generator *this_local;
  
  bVar1 = std::
          vector<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
          ::empty(&this->member_mapping_scopes);
  if (bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "internal error: cleanup_member_name_mapping() no scope active";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  pvVar2 = std::
           vector<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
           ::back(&this->member_mapping_scopes);
  if (pvVar2->scope_member != scope) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "internal error: cleanup_member_name_mapping() called for wrong struct";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
  ::pop_back(&this->member_mapping_scopes);
  return;
}

Assistant:

void t_netstd_generator::cleanup_member_name_mapping(void* scope)
{
    if (member_mapping_scopes.empty())
    {
        throw "internal error: cleanup_member_name_mapping() no scope active";
    }

    member_mapping_scope& active = member_mapping_scopes.back();
    if (active.scope_member != scope)
    {
        throw "internal error: cleanup_member_name_mapping() called for wrong struct";
    }

    member_mapping_scopes.pop_back();
}